

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O3

RegSlot __thiscall FuncInfo::AcquireTmpRegister(FuncInfo *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint uVar5;
  
  uVar5 = this->firstTmpReg;
  if (uVar5 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/FuncInfo.cpp"
                       ,0xfc,"(this->firstTmpReg != Js::Constants::NoRegister)",
                       "this->firstTmpReg != Js::Constants::NoRegister");
    if (!bVar2) goto LAB_0089ed34;
    *puVar4 = 0;
    uVar5 = this->firstTmpReg;
  }
  uVar3 = this->curTmpReg;
  if ((this->varRegsCount < uVar3) || (uVar3 < uVar5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/FuncInfo.cpp"
                       ,0xfe,
                       "(this->curTmpReg <= this->varRegsCount && this->curTmpReg >= this->firstTmpReg)"
                       ,
                       "this->curTmpReg <= this->varRegsCount && this->curTmpReg >= this->firstTmpReg"
                      );
    if (!bVar2) {
LAB_0089ed34:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    uVar3 = this->curTmpReg;
  }
  uVar5 = uVar3 + 1;
  this->curTmpReg = uVar5;
  if (uVar5 != 0) {
    if (this->varRegsCount < uVar5) {
      this->varRegsCount = uVar5;
    }
    return uVar3;
  }
  Math::DefaultOverflowPolicy();
}

Assistant:

Js::RegSlot FuncInfo::AcquireTmpRegister()
{
    Assert(this->firstTmpReg != Js::Constants::NoRegister);
    // Allocate a new temp pseudo-register, increasing the locals count if necessary.
    Assert(this->curTmpReg <= this->varRegsCount && this->curTmpReg >= this->firstTmpReg);
    Js::RegSlot tmpReg = this->curTmpReg;
    UInt32Math::Inc(this->curTmpReg);
    if (this->curTmpReg > this->varRegsCount)
    {
        this->varRegsCount = this->curTmpReg;
    }
    return tmpReg;
}